

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

int32_t icu_63::Normalizer2Impl::combine(uint16_t *list,UChar32 trail)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t secondUnit;
  uint16_t key2;
  uint16_t firstUnit;
  uint16_t key1;
  UChar32 trail_local;
  uint16_t *list_local;
  
  _firstUnit = list;
  if (trail < 0x3400) {
    for (; uVar3 = *_firstUnit, (uint)uVar3 < (trail << 1 & 0xffffU);
        _firstUnit = _firstUnit + (int)((uVar3 & 1) + 2)) {
    }
    if ((ushort)(trail << 1) == (uVar3 & 0x7ffe)) {
      if ((uVar3 & 1) == 0) {
        return (uint)_firstUnit[1];
      }
      return CONCAT22(_firstUnit[1],_firstUnit[2]);
    }
  }
  else {
    uVar3 = ((ushort)(trail >> 9) & 0xfffe) + 0x3400;
    while( true ) {
      for (; uVar1 = *_firstUnit, uVar1 < uVar3; _firstUnit = _firstUnit + (int)((uVar1 & 1) + 2)) {
      }
      if (uVar3 != (uVar1 & 0x7ffe)) {
        return -1;
      }
      uVar2 = _firstUnit[1];
      if ((trail << 6 & 0xffffU) <= (uint)uVar2) break;
      if ((uVar1 & 0x8000) != 0) {
        return -1;
      }
      _firstUnit = _firstUnit + 3;
    }
    if ((ushort)(trail << 6) == (uVar2 & 0xffc0)) {
      return (uVar2 & 0xffff003f) << 0x10 | (uint)_firstUnit[2];
    }
  }
  return -1;
}

Assistant:

int32_t Normalizer2Impl::combine(const uint16_t *list, UChar32 trail) {
    uint16_t key1, firstUnit;
    if(trail<COMP_1_TRAIL_LIMIT) {
        // trail character is 0..33FF
        // result entry may have 2 or 3 units
        key1=(uint16_t)(trail<<1);
        while(key1>(firstUnit=*list)) {
            list+=2+(firstUnit&COMP_1_TRIPLE);
        }
        if(key1==(firstUnit&COMP_1_TRAIL_MASK)) {
            if(firstUnit&COMP_1_TRIPLE) {
                return ((int32_t)list[1]<<16)|list[2];
            } else {
                return list[1];
            }
        }
    } else {
        // trail character is 3400..10FFFF
        // result entry has 3 units
        key1=(uint16_t)(COMP_1_TRAIL_LIMIT+
                        (((trail>>COMP_1_TRAIL_SHIFT))&
                          ~COMP_1_TRIPLE));
        uint16_t key2=(uint16_t)(trail<<COMP_2_TRAIL_SHIFT);
        uint16_t secondUnit;
        for(;;) {
            if(key1>(firstUnit=*list)) {
                list+=2+(firstUnit&COMP_1_TRIPLE);
            } else if(key1==(firstUnit&COMP_1_TRAIL_MASK)) {
                if(key2>(secondUnit=list[1])) {
                    if(firstUnit&COMP_1_LAST_TUPLE) {
                        break;
                    } else {
                        list+=3;
                    }
                } else if(key2==(secondUnit&COMP_2_TRAIL_MASK)) {
                    return ((int32_t)(secondUnit&~COMP_2_TRAIL_MASK)<<16)|list[2];
                } else {
                    break;
                }
            } else {
                break;
            }
        }
    }
    return -1;
}